

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  undefined8 outputConfig;
  bool bVar1;
  TargetType targetType;
  cmGlobalNinjaGenerator *pcVar2;
  cmGeneratorTarget *pcVar3;
  cmMakefile *this_00;
  string *psVar4;
  ulong uVar5;
  cmLocalNinjaGenerator *pcVar6;
  pointer this_01;
  char *local_578;
  char local_569;
  string local_568;
  string local_548;
  char local_521;
  char *local_520;
  char local_511;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_488;
  reference local_468;
  string *linkCmd;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_420;
  string_view local_400;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  string val;
  string launcher;
  string local_380;
  allocator<char> local_359;
  string local_358;
  string local_338 [8];
  string responseFlag;
  string local_310;
  undefined1 local_2f0 [8];
  string linker;
  RuleVariables vars;
  string local_168;
  undefined1 local_148 [8];
  cmNinjaRule rule;
  string *config_local;
  bool useResponseFile_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  rule._288_8_ = config;
  LanguageLinkerDeviceRule(&local_168,this,config);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  pcVar2 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGlobalNinjaGenerator::HasRule(pcVar2,(string *)local_148);
  if (!bVar1) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&linker.field_2 + 8));
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
    linker.field_2._8_8_ = std::__cxx11::string::c_str();
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    targetType = cmGeneratorTarget::GetType(pcVar3);
    cmState::GetTargetTypeName_abi_cxx11_(targetType);
    std::__cxx11::string::c_str();
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"CUDA",
               (allocator<char> *)(responseFlag.field_2._M_local_buf + 0xf));
    cmGeneratorTarget::GetLinkerTool((string *)local_2f0,pcVar3,&local_310,(string *)rule._288_8_);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)(responseFlag.field_2._M_local_buf + 0xf));
    std::__cxx11::string::c_str();
    this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG",&local_359);
    psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_358);
    std::__cxx11::string::string(local_338,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    if ((useResponseFile) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      std::__cxx11::string::operator=((string *)(rule.DepType.field_2._M_local_buf + 8),"$RSP_FILE")
      ;
      std::__cxx11::string::operator+=(local_338,(string *)(rule.DepType.field_2._M_local_buf + 8));
      pcVar2 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar2);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in_newline");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"CUDA",
                 (allocator<char> *)(launcher.field_2._M_local_buf + 0xf));
      bVar1 = CheckUseResponseFileForLibraries(this,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator((allocator<char> *)(launcher.field_2._M_local_buf + 0xf));
      if (bVar1) {
        std::__cxx11::string::operator+=
                  ((string *)(rule.RspFile.field_2._M_local_buf + 8)," $LINK_LIBRARIES");
      }
      std::__cxx11::string::c_str();
    }
    std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"RULE_LAUNCH_LINK",&local_3e9);
    cmLocalGenerator::GetRuleLauncher
              ((string *)local_3c8,(cmLocalGenerator *)pcVar6,pcVar3,&local_3e8,
               (string *)rule._288_8_);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    local_400 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_3c8);
    bVar1 = cmNonempty(local_400);
    if (bVar1) {
      rulePlaceholderExpander._M_t.
      super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
      .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._7_1_ = 0x20;
      cmStrCat<std::__cxx11::string&,char>
                (&local_420,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                 (char *)((long)&rulePlaceholderExpander._M_t.
                                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>.
                                 _M_head_impl + 7));
      std::__cxx11::string::operator=((string *)(val.field_2._M_local_buf + 8),(string *)&local_420)
      ;
      std::__cxx11::string::~string((string *)&local_420);
    }
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[6])
              (&linkCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ComputeDeviceLinkCmd_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,this);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    linkCmd = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&linkCmd);
      if (!bVar1) break;
      local_468 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                (&local_488,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&val.field_2 + 8),local_468);
      std::__cxx11::string::operator=((string *)local_468,(string *)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      this_01 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&linkCmds.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_01,(cmOutputConverter *)pcVar6,local_468,
                 (RuleVariables *)((long)&linker.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmNinjaRemoveNoOpCommands>
              (&__range2);
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    outputConfig = rule._288_8_;
    std::__cxx11::string::string((string *)&local_4d0);
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_4b0,pcVar6,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,(string *)outputConfig,(string *)outputConfig,&local_4d0,
               (cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=
              ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    TargetLinkLanguage(&local_510,this,(string *)rule._288_8_);
    local_511 = ' ';
    local_520 = GetVisibleTypeName(this);
    local_521 = '.';
    cmStrCat<char_const(&)[18],std::__cxx11::string,char,char_const*,char>
              (&local_4f0,(char (*) [18])"Rule for linking ",&local_510,&local_511,&local_520,
               &local_521);
    std::__cxx11::string::operator=
              ((string *)(rule.Description.field_2._M_local_buf + 8),(string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    TargetLinkLanguage(&local_568,this,(string *)rule._288_8_);
    local_569 = ' ';
    local_578 = GetVisibleTypeName(this);
    cmStrCat<char_const(&)[9],std::__cxx11::string,char,char_const*,char_const(&)[14]>
              (&local_548,(char (*) [9])"Linking ",&local_568,&local_569,&local_578,
               (char (*) [14])0x11501b3);
    std::__cxx11::string::operator=
              ((string *)(rule.Command.field_2._M_local_buf + 8),(string *)&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::operator=((string *)(rule.RspContent.field_2._M_local_buf + 8),"$RESTAT");
    pcVar2 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar2,(cmNinjaRule *)local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&linkCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_3c8);
    std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_338);
    std::__cxx11::string::~string((string *)local_2f0);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_148);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule(
  bool useResponseFile, const std::string& config)
{
  cmNinjaRule rule(this->LanguageLinkerDeviceRule(config));
  if (!this->GetGlobalGenerator()->HasRule(rule.Name)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
        .c_str();

    vars.Language = "CUDA";
    std::string linker =
      this->GetGeneratorTarget()->GetLinkerTool("CUDA", config);
    vars.Linker = linker.c_str();

    // build response file name
    std::string responseFlag = this->GetMakefile()->GetSafeDefinition(
      "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG");

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }

      // add the link command in the file if necessary
      if (this->CheckUseResponseFileForLibraries("CUDA")) {
        rule.RspContent += " $LINK_LIBRARIES";
        vars.LinkLibraries = "";
      } else {
        vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }

      vars.Objects = responseFlag.c_str();
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    vars.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";

    std::string launcher;
    std::string val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK", config);
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";

    this->GetGlobalGenerator()->AddRule(rule);
  }
}